

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

uECC_word_t
uECC_vli_sub(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right,wordcount_t num_words)

{
  ulong uVar1;
  uECC_word_t diff;
  uECC_word_t uStack_30;
  wordcount_t i;
  uECC_word_t borrow;
  wordcount_t num_words_local;
  uECC_word_t *right_local;
  uECC_word_t *left_local;
  uECC_word_t *result_local;
  
  uStack_30 = 0;
  for (diff._7_1_ = '\0'; diff._7_1_ < num_words; diff._7_1_ = diff._7_1_ + '\x01') {
    uVar1 = (left[diff._7_1_] - right[diff._7_1_]) - uStack_30;
    if (uVar1 != left[diff._7_1_]) {
      uStack_30 = (uECC_word_t)(int)(uint)(left[diff._7_1_] < uVar1);
    }
    result[diff._7_1_] = uVar1;
  }
  return uStack_30;
}

Assistant:

uECC_VLI_API uECC_word_t uECC_vli_sub(uECC_word_t *result,
                                      const uECC_word_t *left,
                                      const uECC_word_t *right,
                                      wordcount_t num_words) {
    uECC_word_t borrow = 0;
    wordcount_t i;
    for (i = 0; i < num_words; ++i) {
        uECC_word_t diff = left[i] - right[i] - borrow;
        if (diff != left[i]) {
            borrow = (diff > left[i]);
        }
        result[i] = diff;
    }
    return borrow;
}